

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_struct_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_struct_f *pf)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  void *p;
  flatcc_json_printer_struct_f *pf_local;
  size_t len_local;
  char *name_local;
  int id_local;
  flatcc_json_printer_table_descriptor_t *td_local;
  flatcc_json_printer_t *ctx_local;
  
  pvVar3 = get_field_ptr(td,id);
  if (pvVar3 != (void *)0x0) {
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = ',';
    }
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = '{';
    (*pf)(ctx,pvVar3);
    if (ctx->indent != '\0') {
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = '\n';
      ctx->level = ctx->level + -1;
      print_indent(ctx);
    }
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = '}';
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_struct_f *pf)
{
    const void *p = get_field_ptr(td, id);

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        print_name(ctx, name, len);
        print_start('{');
        pf(ctx, p);
        print_end('}');
    }
}